

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O0

uint32_t * __thiscall spirv_cross::Parser::stream(Parser *this,Instruction *instr)

{
  uint32_t uVar1;
  uint32_t uVar2;
  size_type sVar3;
  CompilerError *this_00;
  allocator local_41;
  string local_40 [32];
  Instruction *local_20;
  Instruction *instr_local;
  Parser *this_local;
  
  if (instr->length == 0) {
    this_local = (Parser *)0x0;
  }
  else {
    uVar1 = instr->offset;
    uVar2 = instr->length;
    local_20 = instr;
    instr_local = (Instruction *)this;
    sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&(this->ir).spirv);
    if (sVar3 < uVar1 + uVar2) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_40,"Compiler::stream() out of range.",&local_41);
      CompilerError::CompilerError(this_00,(string *)local_40);
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    this_local = (Parser *)
                 ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&(this->ir).spirv,(ulong)local_20->offset);
  }
  return (uint32_t *)this_local;
}

Assistant:

const uint32_t *Parser::stream(const Instruction &instr) const
{
	// If we're not going to use any arguments, just return nullptr.
	// We want to avoid case where we return an out of range pointer
	// that trips debug assertions on some platforms.
	if (!instr.length)
		return nullptr;

	if (instr.offset + instr.length > ir.spirv.size())
		SPIRV_CROSS_THROW("Compiler::stream() out of range.");
	return &ir.spirv[instr.offset];
}